

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassDeserializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  char *pcVar2;
  FieldDescriptor *pFVar3;
  FieldDescriptor *pFVar4;
  Descriptor *pDVar5;
  long *plVar6;
  string *__return_storage_ptr__;
  GeneratorOptions *extraout_RDX;
  GeneratorOptions *extraout_RDX_00;
  GeneratorOptions *options_00;
  GeneratorOptions *options_01;
  FieldDescriptor *extraout_RDX_01;
  FieldDescriptor *extraout_RDX_02;
  FieldDescriptor *field_00;
  FieldDescriptor *extraout_RDX_03;
  FieldDescriptor *field_01;
  FieldDescriptor *extraout_RDX_04;
  FieldDescriptor *extraout_RDX_05;
  FieldDescriptor *extraout_RDX_06;
  FieldDescriptor FVar7;
  FieldDescriptor *pFVar8;
  BytesMode in_R8D;
  BytesMode bytes_mode;
  undefined1 in_R9B;
  undefined1 drop_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  char **args_3;
  undefined1 in_stack_ffffffffffffff28;
  undefined1 local_d0 [48];
  undefined1 local_a0 [32];
  char *local_80;
  undefined1 local_78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  _func_void_FieldDescriptor_ptr *local_58 [2];
  undefined1 local_48 [16];
  FieldDescriptor *local_38;
  
  pFVar3 = (FieldDescriptor *)(local_d0 + 0x10);
  local_d0._0_8_ = pFVar3;
  pcVar2 = FastInt32ToBufferLeft(*(int32 *)(field + 4),(char *)pFVar3);
  local_d0._8_8_ = (long)pcVar2 - (long)pFVar3;
  pFVar4 = (FieldDescriptor *)(local_a0 + 0x10);
  local_a0._0_8_ = pFVar4;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_a0,local_d0._0_8_,(FieldDescriptor *)(local_d0._0_8_ + local_d0._8_8_))
  ;
  io::Printer::Print<char[4],std::__cxx11::string>
            (printer,"    case $num$:\n",(char (*) [4])0x3e5468,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
  if ((FieldDescriptor *)local_a0._0_8_ != pFVar4) {
    operator_delete((void *)local_a0._0_8_);
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_a0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
               (FieldDescriptor **)local_a0);
  }
  if ((field[2] == (FieldDescriptor)0xb) &&
     (bVar1 = FieldDescriptor::is_map_message_type(field), bVar1)) {
    pFVar3 = anon_unknown_0::MapFieldKey(field);
    pFVar4 = anon_unknown_0::MapFieldValue(field);
    __return_storage_ptr__ = (string *)local_d0;
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (__return_storage_ptr__,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "      var value = msg.get$name$();\n      reader.readMessage(value, function(message, reader) {\n"
               ,(char (*) [5])0x3ea8a1,__return_storage_ptr__);
    options_00 = extraout_RDX;
    if ((FieldDescriptor *)local_d0._0_8_ != (FieldDescriptor *)(local_d0 + 0x10)) {
      operator_delete((void *)local_d0._0_8_);
      options_00 = extraout_RDX_00;
    }
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              ((string *)local_d0,(_anonymous_namespace_ *)pFVar3,options_00,
               (FieldDescriptor *)__return_storage_ptr__);
    (anonymous_namespace)::JSBinaryReaderMethodName_abi_cxx11_
              ((string *)local_a0,(_anonymous_namespace_ *)pFVar4,options_01,
               (FieldDescriptor *)__return_storage_ptr__);
    pFVar8 = (FieldDescriptor *)(local_d0 + 0x10);
    io::Printer::Print<char[12],std::__cxx11::string,char[14],std::__cxx11::string>
              (printer,
               "        jspb.Map.deserializeBinary(message, reader, $keyReaderFn$, $valueReaderFn$",
               (char (*) [12])"keyReaderFn",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
               (char (*) [14])"valueReaderFn",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0);
    if ((FieldDescriptor *)local_a0._0_8_ != (FieldDescriptor *)(local_a0 + 0x10)) {
      operator_delete((void *)local_a0._0_8_);
    }
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar8) {
      operator_delete((void *)local_d0._0_8_);
    }
    if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
    }
    if (pFVar4[2] == (FieldDescriptor)0xb) {
      pDVar5 = FieldDescriptor::message_type(pFVar4);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_d0,
                 (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,pDVar5);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", $messageType$.deserializeBinaryFromReader",(char (*) [12])"messageType",
                 (string *)local_d0);
      field_01 = extraout_RDX_01;
      if ((FieldDescriptor *)local_d0._0_8_ != pFVar8) {
        operator_delete((void *)local_d0._0_8_);
        field_01 = extraout_RDX_02;
      }
    }
    else {
      io::Printer::Print<>(printer,", null");
      field_01 = extraout_RDX_03;
    }
    (anonymous_namespace)::JSFieldDefault_abi_cxx11_
              ((string *)local_d0,(_anonymous_namespace_ *)pFVar3,field_01);
    io::Printer::Print<char[11],std::__cxx11::string>
              (printer,", $defaultKey$",(char (*) [11])"defaultKey",(string *)local_d0);
    pFVar3 = extraout_RDX_04;
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar8) {
      operator_delete((void *)local_d0._0_8_);
      pFVar3 = extraout_RDX_05;
    }
    if (*(once_flag **)(pFVar4 + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = pFVar4;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(pFVar4 + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
      pFVar3 = extraout_RDX_06;
    }
    if (pFVar4[2] == (FieldDescriptor)0xb) {
      pDVar5 = FieldDescriptor::message_type(pFVar4);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                ((string *)local_d0,
                 (_anonymous_namespace_ *)(options->namespace_prefix)._M_dataplus._M_p,
                 (GeneratorOptions *)(options->namespace_prefix)._M_string_length,pDVar5);
      io::Printer::Print<char[12],std::__cxx11::string>
                (printer,", new $messageType$()",(char (*) [12])"messageType",(string *)local_d0);
    }
    else {
      (anonymous_namespace)::JSFieldDefault_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)pFVar4,pFVar3);
      io::Printer::Print<char[13],std::__cxx11::string>
                (printer,", $defaultValue$",(char (*) [13])"defaultValue",(string *)local_d0);
    }
    if ((FieldDescriptor *)local_d0._0_8_ != pFVar8) {
      operator_delete((void *)local_d0._0_8_);
    }
    io::Printer::Print<>(printer,");\n");
    io::Printer::Print<>(printer,"         });\n");
    goto LAB_0025975a;
  }
  if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
    local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
    local_a0._0_8_ = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
               (FieldDescriptor **)local_a0);
  }
  FVar7 = field[2];
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)FVar7 * 4) == 10) {
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              ((string *)local_a0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)FieldDescriptor::kTypeToCppTypeMap);
    if (*(once_flag **)(field + 0x18) == (once_flag *)0x0) {
      FVar7 = field[2];
      local_80 = "Message";
      if (FVar7 == (FieldDescriptor)0xa) {
        local_80 = "Group";
      }
    }
    else {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_78._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_78);
      FVar7 = field[2];
      local_80 = "jspb.Message";
      if (FVar7 == (FieldDescriptor)0xa) {
        local_80 = "msgOrGroup";
      }
      local_80 = local_80 + 5;
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_58[0] = FieldDescriptor::TypeOnceInit;
        local_38 = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),local_58,&local_38);
        FVar7 = field[2];
      }
    }
    if (FVar7 == (FieldDescriptor)0xa) {
      local_d0._0_8_ = pFVar3;
      pcVar2 = FastInt32ToBufferLeft(*(int32 *)(field + 4),(char *)pFVar3);
      local_d0._8_8_ = (long)pcVar2 - (long)pFVar3;
      local_58[0] = (_func_void_FieldDescriptor_ptr *)local_48;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_58,local_d0._0_8_,
                 (FieldDescriptor *)(local_d0._0_8_ + local_d0._8_8_));
      plVar6 = (long *)std::__cxx11::string::append((char *)local_58);
      local_78._0_8_ = local_78 + 0x10;
      pFVar8 = (FieldDescriptor *)(plVar6 + 2);
      if ((FieldDescriptor *)*plVar6 == pFVar8) {
        local_68._M_allocated_capacity = *(undefined8 *)pFVar8;
        local_68._8_8_ = plVar6[3];
      }
      else {
        local_68._M_allocated_capacity = *(undefined8 *)pFVar8;
        local_78._0_8_ = (FieldDescriptor *)*plVar6;
      }
      local_78._8_8_ = plVar6[1];
      *plVar6 = (long)pFVar8;
      plVar6[1] = 0;
      *(undefined1 *)(plVar6 + 2) = 0;
    }
    else {
      local_78._0_8_ = local_78 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"");
    }
    bytes_mode = 0x3e1f99;
    args_3 = &local_80;
    io::Printer::
    Print<char[11],std::__cxx11::string,char[11],char_const*,char[9],std::__cxx11::string>
              (printer,
               "      var value = new $fieldclass$;\n      reader.read$msgOrGroup$($grpfield$value,$fieldclass$.deserializeBinaryFromReader);\n"
               ,(char (*) [11])"fieldclass",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0,
               (char (*) [11])"msgOrGroup",args_3,(char (*) [9])"grpfield",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
    drop_list = SUB81(args_3,0);
    if ((FieldDescriptor *)local_78._0_8_ != (FieldDescriptor *)(local_78 + 0x10)) {
      operator_delete((void *)local_78._0_8_);
    }
    if ((FVar7 == (FieldDescriptor)0xa) &&
       (local_58[0] != (_func_void_FieldDescriptor_ptr *)local_48)) {
      operator_delete(local_58[0]);
    }
    pFVar8 = (FieldDescriptor *)local_a0._0_8_;
    if ((FieldDescriptor *)local_a0._0_8_ != pFVar4) {
LAB_00259654:
      operator_delete(pFVar8);
    }
  }
  else {
    if ((~(byte)field[1] & 0x60) == 0) {
      if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
        local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
        local_a0._0_8_ = field;
        std::
        call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                  (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                   (FieldDescriptor **)local_a0);
        FVar7 = field[2];
      }
      if (0xfffffffb < (byte)FVar7 - 0xd) goto LAB_0025936a;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,true,false,true,BYTES_DEFAULT,
                 (bool)in_stack_ffffffffffffff28);
      (anonymous_namespace)::JSBinaryReaderMethodType_abi_cxx11_
                ((string *)local_a0,(_anonymous_namespace_ *)field,field_00);
      bytes_mode = 0x40f7b1;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,
                 "      var values = /** @type {$fieldtype$} */ (reader.isDelimited() ? reader.readPacked$reader$() : [reader.read$reader$()]);\n"
                 ,(char (*) [10])"fieldtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (char (*) [7])0x40f7b1,pbVar9);
      drop_list = SUB81(pbVar9,0);
      pFVar8 = (FieldDescriptor *)local_d0._0_8_;
      if ((FieldDescriptor *)local_a0._0_8_ != pFVar4) {
        operator_delete((void *)local_a0._0_8_);
        pFVar8 = (FieldDescriptor *)local_d0._0_8_;
      }
    }
    else {
LAB_0025936a:
      bVar1 = false;
      (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
                 (FieldDescriptor *)0x0,true,true,true,BYTES_DEFAULT,(bool)in_stack_ffffffffffffff28
                );
      (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
                ((string *)local_a0,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x0,bVar1);
      bytes_mode = 0x40f7b1;
      pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
      io::Printer::Print<char[10],std::__cxx11::string,char[7],std::__cxx11::string>
                (printer,"      var value = /** @type {$fieldtype$} */ (reader.read$reader$());\n",
                 (char (*) [10])"fieldtype",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0,
                 (char (*) [7])0x40f7b1,pbVar9);
      drop_list = SUB81(pbVar9,0);
      pFVar8 = (FieldDescriptor *)local_d0._0_8_;
      if ((FieldDescriptor *)local_a0._0_8_ != pFVar4) {
        operator_delete((void *)local_a0._0_8_);
        pFVar8 = (FieldDescriptor *)local_d0._0_8_;
      }
    }
    local_d0._0_8_ = pFVar8;
    if (pFVar8 != pFVar3) goto LAB_00259654;
  }
  FVar7 = field[1];
  if ((~(byte)FVar7 & 0x60) == 0) {
    if (*(once_flag **)(field + 0x18) != (once_flag *)0x0) {
      local_d0._0_8_ = FieldDescriptor::TypeOnceInit;
      local_a0._0_8_ = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x18),(_func_void_FieldDescriptor_ptr **)local_d0,
                 (FieldDescriptor **)local_a0);
    }
    if (0xfffffffb < (byte)field[2] - 0xd) {
      FVar7 = field[1];
      goto LAB_002596dc;
    }
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
               (FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
    io::Printer::Print<char[5],std::__cxx11::string>
              (printer,
               "      for (var i = 0; i < values.length; i++) {\n        msg.add$name$(values[i]);\n      }\n"
               ,(char (*) [5])0x3ea8a1,(string *)local_d0);
  }
  else {
LAB_002596dc:
    if ((~(byte)FVar7 & 0x60) == 0) {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x1,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.add$name$(value);\n",(char (*) [5])0x3ea8a1,(string *)local_d0);
    }
    else {
      (anonymous_namespace)::JSGetterName_abi_cxx11_
                ((string *)local_d0,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x0,
                 (FieldDescriptor *)0x0,bytes_mode,(bool)drop_list);
      io::Printer::Print<char[5],std::__cxx11::string>
                (printer,"      msg.set$name$(value);\n",(char (*) [5])0x3ea8a1,(string *)local_d0);
    }
  }
  if ((FieldDescriptor *)local_d0._0_8_ != pFVar3) {
    operator_delete((void *)local_d0._0_8_);
  }
LAB_0025975a:
  io::Printer::Print<>(printer,"      break;\n");
  return;
}

Assistant:

void Generator::GenerateClassDeserializeBinaryField(
    const GeneratorOptions& options, io::Printer* printer,
    const FieldDescriptor* field) const {
  printer->Print("    case $num$:\n", "num", StrCat(field->number()));

  if (field->is_map()) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "      var value = msg.get$name$();\n"
        "      reader.readMessage(value, function(message, reader) {\n",
        "name", JSGetterName(options, field));

    printer->Print(
        "        jspb.Map.deserializeBinary(message, reader, "
        "$keyReaderFn$, $valueReaderFn$",
        "keyReaderFn", JSBinaryReaderMethodName(options, key_field),
        "valueReaderFn", JSBinaryReaderMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.deserializeBinaryFromReader",
                     "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", null");
    }
    printer->Print(", $defaultKey$", "defaultKey", JSFieldDefault(key_field));
    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", new $messageType$()", "messageType",
                     GetMessagePath(options, value_field->message_type()));
    } else {
      printer->Print(", $defaultValue$", "defaultValue",
                     JSFieldDefault(value_field));
    }
    printer->Print(");\n");
    printer->Print("         });\n");
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      printer->Print(
          "      var value = new $fieldclass$;\n"
          "      reader.read$msgOrGroup$($grpfield$value,"
          "$fieldclass$.deserializeBinaryFromReader);\n",
          "fieldclass", SubmessageTypeRef(options, field), "msgOrGroup",
          (field->type() == FieldDescriptor::TYPE_GROUP) ? "Group" : "Message",
          "grpfield",
          (field->type() == FieldDescriptor::TYPE_GROUP)
              ? (StrCat(field->number()) + ", ")
              : "");
    } else if (field->is_packable()) {
      printer->Print(
          "      var values = /** @type {$fieldtype$} */ "
          "(reader.isDelimited() "
          "? reader.readPacked$reader$() : [reader.read$reader$()]);\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ false, BYTES_U8),
          "reader", JSBinaryReaderMethodType(field));
    } else {
      printer->Print(
          "      var value = /** @type {$fieldtype$} */ "
          "(reader.read$reader$());\n",
          "fieldtype",
          JSFieldTypeAnnotation(options, field, false, true,
                                /* singular_if_not_packed */ true, BYTES_U8),
          "reader",
          JSBinaryReadWriteMethodName(field, /* is_writer = */ false));
    }

    if (field->is_packable()) {
      printer->Print(
          "      for (var i = 0; i < values.length; i++) {\n"
          "        msg.add$name$(values[i]);\n"
          "      }\n",
          "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else if (field->is_repeated()) {
      printer->Print(
          "      msg.add$name$(value);\n", "name",
          JSGetterName(options, field, BYTES_DEFAULT, /* drop_list = */ true));
    } else {
      // Singular fields, and packed repeated fields, receive a |value| either
      // as the field's value or as the array of all the field's values; set
      // this as the field's value directly.
      printer->Print("      msg.set$name$(value);\n", "name",
                     JSGetterName(options, field));
    }
  }

  printer->Print("      break;\n");
}